

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

void __thiscall
CMU462::StaticScene::BVHAccel::BVHAccel
          (BVHAccel *this,
          vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          *_primitives,size_t max_leaf_size)

{
  pointer ppPVar1;
  BVHNode *this_00;
  size_t i;
  ulong uVar2;
  ulong range;
  BBox local_108;
  BBox local_b8;
  BBox local_70;
  
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Aggregate).super_Primitive._vptr_Primitive = (_func_int **)&PTR_get_bbox_00274e88;
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  operator=(&(this->super_Aggregate).primitives,_primitives);
  local_108.max.x._0_4_ = 0;
  local_108.max.x._4_4_ = 0xfff00000;
  local_108.max.y._0_4_ = 0;
  local_108.max.y._4_4_ = 0xfff00000;
  local_108.max.z = -INFINITY;
  local_108.min.x = INFINITY;
  local_108.min.y = INFINITY;
  local_108.min.z = INFINITY;
  local_108.extent.x._0_4_ = 0;
  local_108.extent.x._4_4_ = 0xfff00000;
  local_108.extent.y._0_4_ = 0;
  local_108.extent.y._4_4_ = 0xfff00000;
  local_108.extent.z = -INFINITY;
  uVar2 = 0;
  while( true ) {
    ppPVar1 = (this->super_Aggregate).primitives.
              super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    range = (long)(this->super_Aggregate).primitives.
                  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3;
    if (range <= uVar2) break;
    (**ppPVar1[uVar2]->_vptr_Primitive)(&local_70);
    BBox::expand(&local_108,&local_70);
    uVar2 = uVar2 + 1;
  }
  this_00 = (BVHNode *)operator_new(0x68);
  local_b8.max.x = (double)CONCAT44(local_108.max.x._4_4_,local_108.max.x._0_4_);
  local_b8.max.y = (double)CONCAT44(local_108.max.y._4_4_,local_108.max.y._0_4_);
  local_b8.extent.x = (double)CONCAT44(local_108.extent.x._4_4_,local_108.extent.x._0_4_);
  local_b8.extent.y = (double)CONCAT44(local_108.extent.y._4_4_,local_108.extent.y._0_4_);
  local_b8.max.z = local_108.max.z;
  local_b8.min.x = local_108.min.x;
  local_b8.min.y = local_108.min.y;
  local_b8.min.z = local_108.min.z;
  local_b8.extent.z = local_108.extent.z;
  BVHNode::BVHNode(this_00,&local_b8,0,range);
  this->root = this_00;
  return;
}

Assistant:

BVHAccel::BVHAccel(const std::vector<Primitive *> &_primitives,
      size_t max_leaf_size) {

    this->primitives = _primitives;

    // TODO:
    // Construct a BVH from the given vector of primitives and maximum leaf
    // size configuration. The starter code build a BVH aggregate with a
    // single leaf node (which is also the root) that encloses all the
    // primitives.

    BBox bb;
    for (size_t i = 0; i < primitives.size(); ++i) {
      bb.expand(primitives[i]->get_bbox());
    }

    root = new BVHNode(bb, 0, primitives.size());

  }